

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  char cVar1;
  short sVar2;
  sqlite3 *db;
  Table *pTVar3;
  bool bVar4;
  int iVar5;
  FKey *__s;
  FKey *pFVar6;
  uint uVar7;
  char *pcVar8;
  Column *pCVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  sColMap *z;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  ulong local_80;
  
  db = pParse->db;
  pTVar3 = pParse->pNewTable;
  if ((pTVar3 != (Table *)0x0) && (pParse->declareVtab == '\0')) {
    if (pFromCol == (ExprList *)0x0) {
      if (pTVar3->nCol < 1) goto LAB_00143d46;
      uVar7 = 1;
      if ((pToCol != (ExprList *)0x0) && (pToCol->nExpr != 1)) {
        __s = (FKey *)0x0;
        sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                        pTVar3->aCol[(ushort)pTVar3->nCol - 1].zName,pTo);
        goto LAB_00143d48;
      }
    }
    else {
      if ((pToCol != (ExprList *)0x0) && (pToCol->nExpr != pFromCol->nExpr)) {
        __s = (FKey *)0x0;
        sqlite3ErrorMsg(pParse,
                        "number of columns in foreign key does not match the number of columns in the referenced table"
                       );
        goto LAB_00143d48;
      }
      uVar7 = pFromCol->nExpr;
    }
    iVar5 = uVar7 * 0x10 + pTo->n + 0x41;
    if ((pToCol != (ExprList *)0x0) && (0 < (long)pToCol->nExpr)) {
      lVar10 = 0;
      do {
        pcVar15 = pToCol->a[lVar10].zName;
        if (pcVar15 == (char *)0x0) {
          iVar12 = 1;
        }
        else {
          uVar11 = 0xffffffff;
          do {
            uVar11 = uVar11 + 1;
            cVar1 = *pcVar15;
            pcVar15 = pcVar15 + 1;
          } while (cVar1 != '\0');
          iVar12 = (uVar11 & 0x3fffffff) + 1;
        }
        iVar5 = iVar5 + iVar12;
        lVar10 = lVar10 + 1;
      } while (lVar10 != pToCol->nExpr);
    }
    __s = (FKey *)sqlite3DbMallocRaw(db,(long)iVar5);
    if (__s == (FKey *)0x0) {
      __s = (FKey *)0x0;
      goto LAB_00143d48;
    }
    memset(__s,0,(long)iVar5);
    __s->pFrom = pTVar3;
    __s->pNextFrom = pTVar3->pFKey;
    z = __s->aCol + (int)uVar7;
    __s->zTo = (char *)z;
    memcpy(z,pTo->z,(ulong)pTo->n);
    *(undefined1 *)((long)&z->iFrom + (ulong)pTo->n) = 0;
    sqlite3Dequote((char *)z);
    uVar11 = pTo->n;
    __s->nCol = uVar7;
    if (pFromCol == (ExprList *)0x0) {
      __s->aCol[0].iFrom = pTVar3->nCol + -1;
    }
    else if (0 < (int)uVar7) {
      sVar2 = pTVar3->nCol;
      lVar10 = (long)sVar2;
      local_80 = 0;
      do {
        if (sVar2 < 1) {
LAB_001440f3:
          sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                          pFromCol->a[local_80 & 0xffffffff].zName);
          goto LAB_00143d48;
        }
        pCVar9 = pTVar3->aCol;
        pcVar15 = pFromCol->a[local_80].zName;
        iVar5 = sqlite3_stricmp(pCVar9->zName,pcVar15);
        if (iVar5 == 0) {
          lVar16 = 0;
          bVar4 = 0 < lVar10;
        }
        else {
          lVar16 = 0;
          do {
            pCVar9 = pCVar9 + 1;
            if (lVar10 + -1 == lVar16) goto LAB_001440f3;
            iVar5 = sqlite3_stricmp(pCVar9->zName,pcVar15);
            lVar16 = lVar16 + 1;
          } while (iVar5 != 0);
          bVar4 = lVar16 < lVar10;
        }
        __s->aCol[local_80].iFrom = (int)lVar16;
        if (!bVar4) goto LAB_001440f3;
        local_80 = local_80 + 1;
      } while (local_80 != uVar7);
    }
    if (0 < (int)uVar7 && pToCol != (ExprList *)0x0) {
      pcVar15 = (char *)((long)&z->iFrom + (ulong)(uVar11 + 1));
      uVar13 = 0;
      do {
        pcVar14 = pToCol->a[uVar13].zName;
        uVar11 = 0;
        if (pcVar14 != (char *)0x0) {
          uVar11 = 0xffffffff;
          pcVar8 = pcVar14;
          do {
            uVar11 = uVar11 + 1;
            cVar1 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar1 != '\0');
          uVar11 = uVar11 & 0x3fffffff;
        }
        __s->aCol[uVar13].zCol = pcVar15;
        memcpy(pcVar15,pcVar14,(ulong)uVar11);
        pcVar14 = pcVar15 + uVar11;
        pcVar15 = pcVar14 + 1;
        *pcVar14 = '\0';
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar7);
    }
    __s->isDeferred = '\0';
    __s->aAction[0] = (u8)flags;
    __s->aAction[1] = (u8)((uint)flags >> 8);
    pFVar6 = (FKey *)sqlite3HashInsert(&pTVar3->pSchema->fkeyHash,__s->zTo,__s);
    if (pFVar6 == __s) {
      db->mallocFailed = '\x01';
      goto LAB_00143d48;
    }
    if (pFVar6 != (FKey *)0x0) {
      __s->pNextTo = pFVar6;
      pFVar6->pPrevTo = __s;
    }
    pTVar3->pFKey = __s;
  }
LAB_00143d46:
  __s = (FKey *)0x0;
LAB_00143d48:
  sqlite3DbFree(db,__s);
  sqlite3ExprListDelete(db,pFromCol);
  sqlite3ExprListDelete(db,pToCol);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  int nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  pFKey->pNextFrom = p->pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zName, pFromCol->a[i].zName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse, 
          "unknown column \"%s\" in foreign key definition", 
          pFromCol->a[i].zName);
        goto fk_end;
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zName);
      pFKey->aCol[i].zCol = z;
      memcpy(z, pToCol->a[i].zName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash, 
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    db->mallocFailed = 1;
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  p->pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}